

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_box.cpp
# Opt level: O1

void Omega_h::make_3d_box(Real x,Real y,Real z,LO nx,LO ny,LO nz,LOs *hv2v_out,Reals *coords_out)

{
  int iVar1;
  ulong uVar2;
  size_type sVar3;
  Reals *pRVar4;
  LOs *pLVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  IntIterator last;
  int iVar10;
  int iVar11;
  Alloc *pAVar12;
  int iVar13;
  double *pdVar14;
  int *piVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  IntIterator last_1;
  double dVar19;
  type fill_conn;
  Write<int> hv2v;
  Write<double> coords;
  type fill_coords;
  string local_118;
  Read<signed_char> local_f8;
  Write<int> local_e0;
  Write<double> local_d0;
  string local_c0;
  double local_a0;
  double local_98;
  Write<double> local_90;
  Write<int> local_80;
  double local_70;
  double local_68;
  double local_60;
  Reals *local_58;
  LOs *local_50;
  Real local_48;
  Real local_40;
  Real local_38;
  
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  local_58 = coords_out;
  local_50 = hv2v_out;
  local_48 = x;
  local_40 = y;
  local_38 = z;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"");
  iVar1 = nx + 1;
  iVar17 = (ny + 1) * iVar1;
  iVar10 = (nz + 1) * iVar17;
  Write<double>::Write(&local_d0,iVar10 * 3,&local_c0);
  local_a0 = (double)ny;
  dVar19 = (double)nx;
  local_98 = (double)nz;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    local_70 = (double)nx;
    local_68 = (double)ny;
    local_60 = (double)nz;
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    local_a0 = local_68;
    dVar19 = local_70;
    local_98 = local_60;
  }
  local_c0.field_2._8_8_ = local_48 / dVar19;
  local_a0 = local_40 / local_a0;
  local_98 = local_38 / local_98;
  local_c0._M_dataplus._M_p._4_4_ = iVar1;
  local_c0._M_dataplus._M_p._0_4_ = iVar17;
  local_c0._M_string_length = (size_type)local_d0.shared_alloc_.alloc;
  if (((ulong)local_d0.shared_alloc_.alloc & 7) == 0 && local_d0.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    if (entering_parallel == '\x01') {
      local_c0._M_string_length = (local_d0.shared_alloc_.alloc)->size * 8 + 1;
    }
    else {
      (local_d0.shared_alloc_.alloc)->use_count = (local_d0.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_c0.field_2._M_allocated_capacity = (size_type)local_d0.shared_alloc_.direct_ptr;
  pAVar12 = (Alloc *)local_c0._M_string_length;
  if ((local_c0._M_string_length & 7) == 0 && (Alloc *)local_c0._M_string_length != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      pAVar12 = (Alloc *)(*(size_t *)local_c0._M_string_length * 8 + 1);
    }
    else {
      *(int *)(local_c0._M_string_length + 0x30) = *(int *)(local_c0._M_string_length + 0x30) + 1;
    }
  }
  if (0 < iVar10) {
    if (((ulong)pAVar12 & 7) == 0 && pAVar12 != (Alloc *)0x0) {
      pAVar12->use_count = pAVar12->use_count + -1;
      pAVar12 = (Alloc *)(pAVar12->size * 8 + 1);
    }
    entering_parallel = '\0';
    pdVar14 = (double *)((long)local_d0.shared_alloc_.direct_ptr + 0x10);
    iVar7 = 0;
    do {
      uVar2 = (ulong)(uint)((int)((long)iVar7 % (long)iVar17) >> 0x1f) << 0x20 |
              (long)iVar7 % (long)iVar17 & 0xffffffffU;
      pdVar14[-2] = (double)(int)((long)uVar2 % (long)iVar1) * (double)local_c0.field_2._8_8_;
      pdVar14[-1] = (double)(int)((long)uVar2 / (long)iVar1) * local_a0;
      *pdVar14 = (double)(iVar7 / iVar17) * local_98;
      iVar7 = iVar7 + 1;
      pdVar14 = pdVar14 + 3;
    } while (iVar10 != iVar7);
    if (((ulong)pAVar12 & 7) == 0 && pAVar12 != (Alloc *)0x0) {
      piVar15 = &pAVar12->use_count;
      *piVar15 = *piVar15 + -1;
      if (*piVar15 == 0) {
        Alloc::~Alloc(pAVar12);
        operator_delete(pAVar12,0x48);
      }
    }
    pAVar12 = (Alloc *)0x0;
  }
  if (((ulong)pAVar12 & 7) == 0 && pAVar12 != (Alloc *)0x0) {
    piVar15 = &pAVar12->use_count;
    *piVar15 = *piVar15 + -1;
    if (*piVar15 == 0) {
      Alloc::~Alloc(pAVar12);
      operator_delete(pAVar12,0x48);
    }
  }
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"");
  iVar10 = ny * nx;
  iVar7 = nz * iVar10;
  Write<int>::Write(&local_e0,iVar7 * 8,&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  local_118._M_dataplus._M_p._4_4_ = nx;
  local_118._M_dataplus._M_p._0_4_ = iVar10;
  local_118._M_string_length = (size_type)local_e0.shared_alloc_.alloc;
  if (((ulong)local_e0.shared_alloc_.alloc & 7) == 0 && local_e0.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    if (entering_parallel == '\x01') {
      local_118._M_string_length = (local_e0.shared_alloc_.alloc)->size * 8 + 1;
    }
    else {
      (local_e0.shared_alloc_.alloc)->use_count = (local_e0.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_118.field_2._M_allocated_capacity = (size_type)local_e0.shared_alloc_.direct_ptr;
  pAVar12 = (Alloc *)local_118._M_string_length;
  if ((local_118._M_string_length & 7) == 0 && (Alloc *)local_118._M_string_length != (Alloc *)0x0)
  {
    if (entering_parallel == '\x01') {
      pAVar12 = (Alloc *)(*(size_t *)local_118._M_string_length * 8 + 1);
    }
    else {
      *(int *)(local_118._M_string_length + 0x30) = *(int *)(local_118._M_string_length + 0x30) + 1;
    }
  }
  local_118.field_2._8_4_ = iVar17;
  local_118.field_2._12_4_ = iVar1;
  if (0 < iVar7) {
    if (((ulong)pAVar12 & 7) == 0 && pAVar12 != (Alloc *)0x0) {
      pAVar12->use_count = pAVar12->use_count + -1;
      pAVar12 = (Alloc *)(pAVar12->size * 8 + 1);
    }
    entering_parallel = '\0';
    piVar15 = (int *)((long)local_e0.shared_alloc_.direct_ptr + 0x1c);
    iVar8 = 0;
    do {
      uVar2 = (ulong)(uint)((int)((long)iVar8 % (long)iVar10) >> 0x1f) << 0x20 |
              (long)iVar8 % (long)iVar10 & 0xffffffffU;
      iVar16 = (iVar8 / iVar10) * iVar17;
      iVar6 = (int)((long)uVar2 / (long)nx);
      iVar11 = iVar6 * iVar1;
      iVar9 = (int)((long)uVar2 % (long)nx);
      iVar18 = iVar9 + iVar16;
      iVar16 = iVar16 + iVar9 + 1;
      piVar15[-7] = iVar11 + iVar18;
      iVar6 = (iVar6 + 1) * iVar1;
      piVar15[-6] = iVar11 + iVar16;
      piVar15[-5] = iVar16 + iVar6;
      iVar13 = (iVar8 / iVar10 + 1) * iVar17;
      iVar16 = iVar13 + iVar9 + 1;
      piVar15[-4] = iVar18 + iVar6;
      iVar9 = iVar9 + iVar13;
      piVar15[-3] = iVar9 + iVar11;
      piVar15[-2] = iVar11 + iVar16;
      piVar15[-1] = iVar16 + iVar6;
      *piVar15 = iVar9 + iVar6;
      iVar8 = iVar8 + 1;
      piVar15 = piVar15 + 8;
    } while (iVar7 != iVar8);
    if (((ulong)pAVar12 & 7) == 0 && pAVar12 != (Alloc *)0x0) {
      piVar15 = &pAVar12->use_count;
      *piVar15 = *piVar15 + -1;
      if (*piVar15 == 0) {
        Alloc::~Alloc(pAVar12);
        operator_delete(pAVar12,0x48);
      }
    }
    pAVar12 = (Alloc *)0x0;
  }
  if (((ulong)pAVar12 & 7) == 0 && pAVar12 != (Alloc *)0x0) {
    piVar15 = &pAVar12->use_count;
    *piVar15 = *piVar15 + -1;
    if (*piVar15 == 0) {
      Alloc::~Alloc(pAVar12);
      operator_delete(pAVar12,0x48);
    }
  }
  pLVar5 = local_50;
  local_80.shared_alloc_.alloc = local_e0.shared_alloc_.alloc;
  if (((ulong)local_e0.shared_alloc_.alloc & 7) == 0 && local_e0.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    if (entering_parallel == '\x01') {
      local_80.shared_alloc_.alloc = (Alloc *)((local_e0.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_e0.shared_alloc_.alloc)->use_count = (local_e0.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_80.shared_alloc_.direct_ptr = local_e0.shared_alloc_.direct_ptr;
  Read<int>::Read(&local_f8,&local_80);
  pAVar12 = (pLVar5->write_).shared_alloc_.alloc;
  if (((ulong)pAVar12 & 7) == 0 && pAVar12 != (Alloc *)0x0) {
    piVar15 = &pAVar12->use_count;
    *piVar15 = *piVar15 + -1;
    if (*piVar15 == 0) {
      Alloc::~Alloc(pAVar12);
      operator_delete(pAVar12,0x48);
    }
  }
  pRVar4 = local_58;
  pAVar12 = local_80.shared_alloc_.alloc;
  (pLVar5->write_).shared_alloc_.alloc = local_f8.write_.shared_alloc_.alloc;
  (pLVar5->write_).shared_alloc_.direct_ptr = local_f8.write_.shared_alloc_.direct_ptr;
  if ((((ulong)local_f8.write_.shared_alloc_.alloc & 7) == 0 &&
       local_f8.write_.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
    (local_f8.write_.shared_alloc_.alloc)->use_count =
         (local_f8.write_.shared_alloc_.alloc)->use_count + -1;
    (pLVar5->write_).shared_alloc_.alloc =
         (Alloc *)((local_f8.write_.shared_alloc_.alloc)->size * 8 + 1);
  }
  local_f8.write_.shared_alloc_.alloc = (Alloc *)0x0;
  local_f8.write_.shared_alloc_.direct_ptr = (void *)0x0;
  if (((ulong)local_80.shared_alloc_.alloc & 7) == 0 && local_80.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar15 = &(local_80.shared_alloc_.alloc)->use_count;
    *piVar15 = *piVar15 + -1;
    if (*piVar15 == 0) {
      Alloc::~Alloc(local_80.shared_alloc_.alloc);
      operator_delete(pAVar12,0x48);
    }
  }
  local_90.shared_alloc_.alloc = local_d0.shared_alloc_.alloc;
  if (((ulong)local_d0.shared_alloc_.alloc & 7) == 0 && local_d0.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    if (entering_parallel == '\x01') {
      local_90.shared_alloc_.alloc = (Alloc *)((local_d0.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_d0.shared_alloc_.alloc)->use_count = (local_d0.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_90.shared_alloc_.direct_ptr = local_d0.shared_alloc_.direct_ptr;
  Read<double>::Read(&local_f8,&local_90);
  pAVar12 = (pRVar4->write_).shared_alloc_.alloc;
  if (((ulong)pAVar12 & 7) == 0 && pAVar12 != (Alloc *)0x0) {
    piVar15 = &pAVar12->use_count;
    *piVar15 = *piVar15 + -1;
    if (*piVar15 == 0) {
      Alloc::~Alloc(pAVar12);
      operator_delete(pAVar12,0x48);
    }
  }
  pAVar12 = local_90.shared_alloc_.alloc;
  (pRVar4->write_).shared_alloc_.alloc = local_f8.write_.shared_alloc_.alloc;
  (pRVar4->write_).shared_alloc_.direct_ptr = local_f8.write_.shared_alloc_.direct_ptr;
  if ((((ulong)local_f8.write_.shared_alloc_.alloc & 7) == 0 &&
       local_f8.write_.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
    (local_f8.write_.shared_alloc_.alloc)->use_count =
         (local_f8.write_.shared_alloc_.alloc)->use_count + -1;
    (pRVar4->write_).shared_alloc_.alloc =
         (Alloc *)((local_f8.write_.shared_alloc_.alloc)->size * 8 + 1);
  }
  local_f8.write_.shared_alloc_.alloc = (Alloc *)0x0;
  local_f8.write_.shared_alloc_.direct_ptr = (void *)0x0;
  if (((ulong)local_90.shared_alloc_.alloc & 7) == 0 && local_90.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar15 = &(local_90.shared_alloc_.alloc)->use_count;
    *piVar15 = *piVar15 + -1;
    if (*piVar15 == 0) {
      Alloc::~Alloc(local_90.shared_alloc_.alloc);
      operator_delete(pAVar12,0x48);
    }
  }
  sVar3 = local_118._M_string_length;
  if ((local_118._M_string_length & 7) == 0 && (Alloc *)local_118._M_string_length != (Alloc *)0x0)
  {
    piVar15 = (int *)(local_118._M_string_length + 0x30);
    *piVar15 = *piVar15 + -1;
    if (*piVar15 == 0) {
      Alloc::~Alloc((Alloc *)local_118._M_string_length);
      operator_delete((void *)sVar3,0x48);
    }
  }
  if (((ulong)local_e0.shared_alloc_.alloc & 7) == 0 && local_e0.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar15 = &(local_e0.shared_alloc_.alloc)->use_count;
    *piVar15 = *piVar15 + -1;
    if (*piVar15 == 0) {
      Alloc::~Alloc(local_e0.shared_alloc_.alloc);
      operator_delete(local_e0.shared_alloc_.alloc,0x48);
    }
  }
  sVar3 = local_c0._M_string_length;
  if ((local_c0._M_string_length & 7) == 0 && (Alloc *)local_c0._M_string_length != (Alloc *)0x0) {
    piVar15 = (int *)(local_c0._M_string_length + 0x30);
    *piVar15 = *piVar15 + -1;
    if (*piVar15 == 0) {
      Alloc::~Alloc((Alloc *)local_c0._M_string_length);
      operator_delete((void *)sVar3,0x48);
    }
  }
  if (((ulong)local_d0.shared_alloc_.alloc & 7) == 0 && local_d0.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar15 = &(local_d0.shared_alloc_.alloc)->use_count;
    *piVar15 = *piVar15 + -1;
    if (*piVar15 == 0) {
      Alloc::~Alloc(local_d0.shared_alloc_.alloc);
      operator_delete(local_d0.shared_alloc_.alloc,0x48);
    }
  }
  return;
}

Assistant:

void make_3d_box(Real x, Real y, Real z, LO nx, LO ny, LO nz, LOs* hv2v_out,
    Reals* coords_out) {
  LO nxy = nx * ny;
  LO nh = nx * ny * nz;
  LO nvx = nx + 1;
  LO nvy = ny + 1;
  LO nvz = nz + 1;
  LO nvxy = nvx * nvy;
  LO nv = nvx * nvy * nvz;
  Real dx = x / nx;
  Real dy = y / ny;
  Real dz = z / nz;
  Write<Real> coords(nv * 3);
  auto fill_coords = OMEGA_H_LAMBDA(LO v) {
    LO ij = v % nvxy;
    LO k = v / nvxy;
    LO i = ij % nvx;
    LO j = ij / nvx;
    coords[v * 3 + 0] = i * dx;
    coords[v * 3 + 1] = j * dy;
    coords[v * 3 + 2] = k * dz;
  };
  parallel_for(nv, fill_coords, "make_3d_box(coords)");
  Write<LO> hv2v(nh * 8);
  auto fill_conn = OMEGA_H_LAMBDA(LO h) {
    LO ij = h % nxy;
    LO k = h / nxy;
    LO i = ij % nx;
    LO j = ij / nx;
    hv2v[h * 8 + 0] = (k + 0) * nvxy + (j + 0) * nvx + (i + 0);
    hv2v[h * 8 + 1] = (k + 0) * nvxy + (j + 0) * nvx + (i + 1);
    hv2v[h * 8 + 2] = (k + 0) * nvxy + (j + 1) * nvx + (i + 1);
    hv2v[h * 8 + 3] = (k + 0) * nvxy + (j + 1) * nvx + (i + 0);
    hv2v[h * 8 + 4] = (k + 1) * nvxy + (j + 0) * nvx + (i + 0);
    hv2v[h * 8 + 5] = (k + 1) * nvxy + (j + 0) * nvx + (i + 1);
    hv2v[h * 8 + 6] = (k + 1) * nvxy + (j + 1) * nvx + (i + 1);
    hv2v[h * 8 + 7] = (k + 1) * nvxy + (j + 1) * nvx + (i + 0);
  };
  parallel_for(nh, fill_conn, "make_3d_box(conn)");
  *hv2v_out = hv2v;
  *coords_out = coords;
}